

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariableForAt(cmCommandArgumentParserHelper *this,char *var)

{
  char local_e1;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  undefined1 local_80 [8];
  string ref;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *ret;
  char *var_local;
  cmCommandArgumentParserHelper *this_local;
  
  ret = var;
  var_local = (char *)this;
  if ((this->ReplaceAtSyntax & 1U) != 0) {
    local_28 = ExpandVariable(this,var);
    if ((local_28 == (char *)0x0) && ((this->RemoveEmpty & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      return (char *)this_local;
    }
    if (local_28 != (char *)0x0) {
      return local_28;
    }
    local_28 = (char *)0x0;
  }
  cmAlphaNum::cmAlphaNum(&local_b0,'@');
  cmAlphaNum::cmAlphaNum(&local_e0,ret);
  local_e1 = '@';
  cmStrCat<char>((string *)local_80,&local_b0,&local_e0,&local_e1);
  this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariableForAt(const char* var)
{
  if (this->ReplaceAtSyntax) {
    // try to expand the variable
    const char* ret = this->ExpandVariable(var);
    // if the return was 0 and we want to replace empty strings
    // then return an empty string
    if (!ret && this->RemoveEmpty) {
      return this->AddString("");
    }
    // if the ret was not 0, then return it
    if (ret) {
      return ret;
    }
  }
  // at this point we want to put it back because of one of these cases:
  // - this->ReplaceAtSyntax is false
  // - this->ReplaceAtSyntax is true, but this->RemoveEmpty is false,
  //   and the variable was not defined
  std::string ref = cmStrCat('@', var, '@');
  return this->AddString(ref);
}